

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

GlContext * sf::priv::GlContext::create(void)

{
  GlContext *pGVar1;
  GlContext *unaff_retaddr;
  GlxContext *in_stack_00000018;
  GlxContext *in_stack_00000020;
  GlContext *context;
  Lock lock;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  Mutex *in_stack_ffffffffffffffa8;
  Lock *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 active;
  GlContext *in_stack_ffffffffffffffc8;
  ContextSettings *in_stack_fffffffffffffff8;
  
  active = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  Lock::Lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  setActive(in_stack_ffffffffffffffc8,(bool)active);
  pGVar1 = (GlContext *)operator_new(0x58);
  GlxContext::GlxContext(in_stack_00000020,in_stack_00000018);
  setActive(in_stack_ffffffffffffffc8,SUB81((ulong)pGVar1 >> 0x38,0));
  uVar2 = 0;
  ContextSettings::ContextSettings((ContextSettings *)&stack0xffffffffffffffc8,0,0,0,1,1,0,false);
  initialize(unaff_retaddr,in_stack_fffffffffffffff8);
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  return pGVar1;
}

Assistant:

GlContext* GlContext::create()
{
    using GlContextImpl::mutex;
    using GlContextImpl::sharedContext;

    // Make sure that there's an active context (context creation may need extensions, and thus a valid context)
    assert(sharedContext != NULL);

    Lock lock(mutex);

    GlContext* context = NULL;

    // We don't use acquireTransientContext here since we have
    // to ensure we have exclusive access to the shared context
    // in order to make sure it is not active during context creation
    {
        sharedContext->setActive(true);

        // Create the context
        context = new ContextType(sharedContext);

        sharedContext->setActive(false);
    }

    context->initialize(ContextSettings());

    return context;
}